

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

int __thiscall embree::Scene::bind(Scene *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  Device *pDVar1;
  float **ppfVar2;
  uint *ptr;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  bool bVar5;
  int iVar6;
  size_t i;
  undefined8 *puVar7;
  ulong uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  Lock<embree::MutexSys> lock;
  undefined1 *local_68;
  long local_60;
  undefined1 local_58 [16];
  MutexSys *local_48;
  MutexSys *local_40;
  undefined1 local_38;
  
  local_48 = &this->geometriesMutex;
  local_38 = 1;
  local_40 = local_48;
  MutexSys::lock(local_48);
  if (__fd == -1) {
    __fd = IDPool<unsigned_int,_4294967294UL>::allocate(&this->id_pool);
    if (__fd == 0xffffffff) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"too many geometries inside scene","");
      *puVar7 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar7 + 1) = 3;
      puVar7[2] = puVar7 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar7 + 2),local_68,local_68 + local_60)
      ;
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  else {
    bVar5 = IDPool<unsigned_int,_4294967294UL>::add(&this->id_pool,__fd);
    if (!bVar5) {
      puVar7 = (undefined8 *)__cxa_allocate_exception(0x30);
      local_68 = local_58;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"invalid geometry ID provided","");
      *puVar7 = &PTR__rtcore_error_02184a18;
      *(undefined4 *)(puVar7 + 1) = 3;
      puVar7[2] = puVar7 + 4;
      std::__cxx11::string::_M_construct<char*>((string *)(puVar7 + 2),local_68,local_68 + local_60)
      ;
      __cxa_throw(puVar7,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
    }
  }
  uVar14 = (ulong)(uint)__fd;
  uVar8 = (this->geometries).size_active;
  if (uVar14 < uVar8) goto LAB_00944aa1;
  uVar10 = (ulong)(__fd + 1);
  uVar13 = (this->geometries).size_alloced;
  if (uVar13 < uVar10) {
    uVar12 = uVar10;
    uVar11 = uVar13;
    if (uVar13 != 0) {
      do {
        uVar12 = uVar11 * 2 + (ulong)(uVar11 * 2 == 0);
        uVar11 = uVar12;
      } while (uVar12 < uVar10);
    }
    if (uVar13 == uVar12) goto LAB_00944875;
    pDVar1 = (this->geometries).alloc.device;
    pRVar3 = (this->geometries).items;
    iVar6 = (*(pDVar1->super_State).super_RefCount._vptr_RefCount[8])(pDVar1,uVar12 * 8,8);
    (this->geometries).items = (Ref<embree::Geometry> *)CONCAT44(extraout_var,iVar6);
    if ((this->geometries).size_active == 0) {
      uVar8 = 0;
LAB_00944902:
      do {
        (this->geometries).items[uVar8].ptr = (Geometry *)0x0;
        uVar8 = uVar8 + 1;
      } while (uVar10 != uVar8);
    }
    else {
      uVar13 = 0;
      do {
        (this->geometries).items[uVar13].ptr = pRVar3[uVar13].ptr;
        pRVar3[uVar13].ptr = (Geometry *)0x0;
        uVar13 = uVar13 + 1;
        uVar8 = (this->geometries).size_active;
      } while (uVar13 < uVar8);
      if (uVar8 < uVar10) goto LAB_00944902;
    }
    pDVar1 = (this->geometries).alloc.device;
    if (pDVar1 != (Device *)0x0) {
      (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,pRVar3);
    }
    (this->geometries).size_active = uVar10;
    (this->geometries).size_alloced = uVar12;
  }
  else {
LAB_00944875:
    do {
      (this->geometries).items[uVar8].ptr = (Geometry *)0x0;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
    (this->geometries).size_active = uVar10;
  }
  uVar8 = (this->vertices).size_alloced;
  uVar13 = uVar8;
  if ((uVar8 < uVar10) && (uVar13 = uVar10, uVar12 = uVar8, uVar8 != 0)) {
    do {
      uVar13 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
      uVar12 = uVar13;
    } while (uVar13 < uVar10);
  }
  if (uVar10 < (this->vertices).size_active) {
    (this->vertices).size_active = uVar10;
  }
  if (uVar8 == uVar13) {
    (this->vertices).size_active = uVar10;
  }
  else {
    pDVar1 = (this->vertices).alloc.device;
    ppfVar2 = (this->vertices).items;
    iVar6 = (*(pDVar1->super_State).super_RefCount._vptr_RefCount[8])(pDVar1,uVar13 * 8,8,3);
    (this->vertices).items = (float **)CONCAT44(extraout_var_00,iVar6);
    if ((this->vertices).size_active != 0) {
      uVar8 = 0;
      do {
        (this->vertices).items[uVar8] = ppfVar2[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 < (this->vertices).size_active);
    }
    pDVar1 = (this->vertices).alloc.device;
    if (pDVar1 != (Device *)0x0) {
      (*(pDVar1->super_State).super_RefCount._vptr_RefCount[9])(pDVar1,ppfVar2);
    }
    (this->vertices).size_active = uVar10;
    (this->vertices).size_alloced = uVar13;
  }
  uVar8 = (this->geometryModCounters_).size_alloced;
  uVar13 = uVar8;
  if ((uVar8 < uVar10) && (uVar13 = uVar10, uVar12 = uVar8, uVar8 != 0)) {
    do {
      uVar13 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
      uVar12 = uVar13;
    } while (uVar13 < uVar10);
  }
  if (uVar10 < (this->geometryModCounters_).size_active) {
    (this->geometryModCounters_).size_active = uVar10;
  }
  if (uVar8 == uVar13) {
    (this->geometryModCounters_).size_active = uVar10;
  }
  else {
    ptr = (this->geometryModCounters_).items;
    puVar9 = (uint *)alignedMalloc(uVar13 * 4,4);
    (this->geometryModCounters_).items = puVar9;
    if ((this->geometryModCounters_).size_active != 0) {
      uVar8 = 0;
      do {
        (this->geometryModCounters_).items[uVar8] = ptr[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar8 < (this->geometryModCounters_).size_active);
    }
    alignedFree(ptr);
    (this->geometryModCounters_).size_active = uVar10;
    (this->geometryModCounters_).size_alloced = uVar13;
  }
LAB_00944aa1:
  pRVar3 = (this->geometries).items;
  if (*(long **)__addr != (long *)0x0) {
    (**(code **)(**(long **)__addr + 0x10))();
  }
  pGVar4 = pRVar3[uVar14].ptr;
  if (pGVar4 != (Geometry *)0x0) {
    (*(pGVar4->super_RefCount)._vptr_RefCount[3])();
  }
  pRVar3[uVar14].ptr = *(Geometry **)__addr;
  (this->geometryModCounters_).items[uVar14] = 0;
  if ((*(byte *)(*(long *)__addr + 0x3e) & 0x20) != 0) {
    this->modified = true;
  }
  MutexSys::unlock(local_48);
  return __fd;
}

Assistant:

unsigned Scene::bind(unsigned geomID, Ref<Geometry> geometry) 
  {
    Lock<MutexSys> lock(geometriesMutex);
    if (geomID == RTC_INVALID_GEOMETRY_ID) {
      geomID = id_pool.allocate();
      if (geomID == RTC_INVALID_GEOMETRY_ID)
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"too many geometries inside scene");
    }
    else
    {
      if (!id_pool.add(geomID))
        throw_RTCError(RTC_ERROR_INVALID_OPERATION,"invalid geometry ID provided");
    }
    if (geomID >= geometries.size()) {
      geometries.resize(geomID+1);
      vertices.resize(geomID+1);
      geometryModCounters_.resize(geomID+1);
    }
    geometries[geomID] = geometry;
    geometryModCounters_[geomID] = 0;
    if (geometry->isEnabled()) {
      setModified ();
    }
    return geomID;
  }